

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.cpp
# Opt level: O2

bool __thiscall
Sonne::Counter::_CompareStringToBuffer
          (Counter *this,vector<char,_std::allocator<char>_> *buffer,string *compare,size_t *start)

{
  char cVar1;
  size_t in_RAX;
  char *pcVar2;
  string *this_00;
  size_t i;
  ulong uVar3;
  bool bVar4;
  size_t local_38;
  
  if ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start[*start] == *(compare->_M_dataplus)._M_p) {
    uVar3 = 1;
    local_38 = in_RAX;
    do {
      bVar4 = compare->_M_string_length <= uVar3;
      if (bVar4) {
        return bVar4;
      }
      this_00 = compare;
      pcVar2 = (char *)std::__cxx11::string::at((ulong)compare);
      local_38 = *start + uVar3;
      cVar1 = _GetBufferLookahead((Counter *)this_00,buffer,&local_38);
      uVar3 = uVar3 + 1;
    } while (cVar1 == *pcVar2);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Counter::_CompareStringToBuffer(std::vector<char>& buffer, std::string& compare, const size_t& start)
{
    // check if the first character matches, and if not we can already say that the string doesn't match
    if (buffer[start] != compare[0])
    {
        return false;
    }

    for (size_t i = 1; i < compare.size(); i++)
    {
        char& compareChar = compare.at(i);

        if (_GetBufferLookahead(buffer, start + i) != compareChar)
        {
            return false; // the current character is not the same of that in the buffer, so no match
        }
    }

    return true;
}